

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileCopier::DefaultFilePermissions(cmFileCopier *this)

{
  cmFileCopier *this_local;
  
  this->FilePermissions = 0;
  this->FilePermissions = mode_owner_read | this->FilePermissions;
  this->FilePermissions = mode_owner_write | this->FilePermissions;
  this->FilePermissions = mode_group_read | this->FilePermissions;
  this->FilePermissions = mode_world_read | this->FilePermissions;
  return;
}

Assistant:

virtual void DefaultFilePermissions()
    {
    // Use read/write permissions.
    this->FilePermissions = 0;
    this->FilePermissions |= mode_owner_read;
    this->FilePermissions |= mode_owner_write;
    this->FilePermissions |= mode_group_read;
    this->FilePermissions |= mode_world_read;
    }